

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

state_status_t
tchecker::ta::prev(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
                  sync_id_t *sync_id,clock_constraint_container_t *src_invariant,
                  clock_constraint_container_t *guard,clock_reset_container_t *reset,
                  clock_constraint_container_t *tgt_invariant,incoming_edges_value_t *v)

{
  int iVar1;
  uint uVar2;
  integer_iterator_t<int> *piVar3;
  bool bVar4;
  state_status_t sVar5;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar6;
  EVP_PKEY_CTX *pEVar7;
  make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *pmVar8;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *pmVar9;
  uint *puVar10;
  make_array_t<int,_4UL,_tchecker::intval_base_t> *pmVar11;
  int *piVar12;
  uint *puVar13;
  int *piVar14;
  capacity_t_conflict i;
  ulong uVar15;
  uint uVar16;
  iterator iVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vloc_src;
  vector<int,_std::allocator<int>_> intval_src;
  undefined1 local_98 [16];
  vector<int,_std::allocator<int>_> intval_tgt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vloc_tgt;
  
  pmVar6 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator->(vloc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vloc_tgt,
             (ulong)(pmVar6->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                    super_array_capacity_t<unsigned_int>._capacity,(allocator_type *)&vloc_src);
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator*(vloc);
  copy((EVP_PKEY_CTX *)&vloc_tgt,pEVar7);
  pmVar8 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator->(intval);
  std::vector<int,_std::allocator<int>_>::vector
            (&intval_tgt,
             (ulong)(pmVar8->super_intval_t).super_integer_array_t.super_intval_base_t.
                    super_array_capacity_t<unsigned_short>._capacity,(allocator_type *)&vloc_src);
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator*(intval);
  copy((EVP_PKEY_CTX *)&intval_tgt,pEVar7);
  syncprod::edges_iterator_t::edges_iterator_t
            ((edges_iterator_t *)&vloc_src,
             &(v->
              super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
              ).
              super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>.
              _M_head_impl.edges._begin);
  syncprod::edges_iterator_t::edges_iterator_t
            ((edges_iterator_t *)&intval_src,
             &(v->
              super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
              ).
              super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>.
              _M_head_impl.edges._end);
  while (bVar4 = syncprod::edges_iterator_t::operator!=
                           ((edges_iterator_t *)&vloc_src,(edges_iterator_t *)&intval_src), bVar4) {
    syncprod::edges_iterator_t::operator*((edges_iterator_t *)local_98);
    uVar16 = *(loc_id_t *)(local_98._0_8_ + 8);
    pmVar9 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*(vloc);
    puVar10 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                        (pmVar9,*(process_id_t *)local_98._0_8_);
    *puVar10 = uVar16;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    syncprod::edges_iterator_t::operator++((edges_iterator_t *)&vloc_src);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  piVar3 = (v->
           super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
           ).
           super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
           .
           super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
           ._M_head_impl._end._it._M_current;
  i = 0;
  for (iVar17._M_current =
            (v->
            super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
            ).
            super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
            .
            super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
            ._M_head_impl._begin._it._M_current; iVar17._M_current != piVar3;
      iVar17._M_current = iVar17._M_current + 1) {
    iVar1 = (iVar17._M_current)->_current;
    pmVar11 = (make_array_t<int,_4UL,_tchecker::intval_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
              ::operator*(intval);
    piVar12 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[](pmVar11,i);
    *piVar12 = iVar1;
    i = i + 1;
  }
  pmVar6 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator->(vloc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vloc_src,
             (ulong)(pmVar6->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                    super_array_capacity_t<unsigned_int>._capacity,(allocator_type *)&intval_src);
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator*(vloc);
  copy((EVP_PKEY_CTX *)&vloc_src,pEVar7);
  pmVar8 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator->(intval);
  std::vector<int,_std::allocator<int>_>::vector
            (&intval_src,
             (ulong)(pmVar8->super_intval_t).super_integer_array_t.super_intval_base_t.
                    super_array_capacity_t<unsigned_short>._capacity,(allocator_type *)local_98);
  pEVar7 = (EVP_PKEY_CTX *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
           ::operator*(intval);
  copy((EVP_PKEY_CTX *)&intval_src,pEVar7);
  sVar5 = next(system,vloc,intval,vedge,sync_id,src_invariant,guard,reset,tgt_invariant,
               &(v->
                super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                ).
                super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>
                ._M_head_impl);
  if (sVar5 == 1) {
    pmVar9 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
             ::operator*(vloc);
    if ((long)vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 !=
        (ulong)(pmVar9->super_vloc_base_t).super_array_capacity_t<unsigned_int>._capacity) {
      __assert_fail("vloc.capacity() == copy.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                    ,0xb0,
                    "bool tchecker::ta::operator!=(const tchecker::vloc_t &, const std::vector<tchecker::loc_id_t> &)"
                   );
    }
    sVar5 = 2;
    uVar15 = 0;
    do {
      if ((pmVar9->super_vloc_base_t).super_array_capacity_t<unsigned_int>._capacity <= uVar15) {
        pmVar11 = (make_array_t<int,_4UL,_tchecker::intval_base_t> *)
                  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                  ::operator*(intval);
        if ((long)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 !=
            (ulong)(pmVar11->super_intval_base_t).super_array_capacity_t<unsigned_short>._capacity)
        {
          __assert_fail("intval.capacity() == copy.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                        ,0xb9,
                        "bool tchecker::ta::operator!=(const tchecker::intval_t &, const std::vector<tchecker::integer_t> &)"
                       );
        }
        uVar15 = 0;
        goto LAB_00169d23;
      }
      puVar13 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[]
                          (pmVar9,(capacity_t)uVar15);
      puVar10 = vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + uVar15;
      uVar15 = uVar15 + 1;
    } while (*puVar13 == *puVar10);
  }
  goto LAB_00169d4d;
  while( true ) {
    piVar14 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                        (pmVar11,(capacity_t_conflict)uVar15);
    piVar12 = intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + uVar15;
    uVar15 = uVar15 + 1;
    if (*piVar14 != *piVar12) break;
LAB_00169d23:
    if ((pmVar11->super_intval_base_t).super_array_capacity_t<unsigned_short>._capacity <= uVar15) {
      pmVar9 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc);
      if ((long)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 !=
          (ulong)(pmVar9->super_vloc_base_t).super_array_capacity_t<unsigned_int>._capacity) {
        __assert_fail("vloc.capacity() == copy.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0x9b,
                      "void tchecker::ta::copy(tchecker::vloc_t &, const std::vector<tchecker::loc_id_t> &)"
                     );
      }
      for (uVar16 = 0;
          (ulong)uVar16 <
          (ulong)((long)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 1) {
        uVar2 = vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16];
        puVar10 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::operator[](pmVar9,uVar16);
        *puVar10 = uVar2;
      }
      pmVar11 = (make_array_t<int,_4UL,_tchecker::intval_base_t> *)
                intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                ::operator*(intval);
      if ((long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 !=
          (ulong)(pmVar11->super_intval_base_t).super_array_capacity_t<unsigned_short>._capacity) {
        __assert_fail("intval.capacity() == copy.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0xa9,
                      "void tchecker::ta::copy(tchecker::intval_t &, const std::vector<tchecker::integer_t> &)"
                     );
      }
      sVar5 = 1;
      for (uVar16 = 0;
          (ulong)uVar16 <
          (ulong)((long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 1) {
        iVar1 = intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16];
        piVar12 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                            (pmVar11,(capacity_t_conflict)uVar16);
        *piVar12 = iVar1;
      }
      break;
    }
  }
LAB_00169d4d:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&intval_src.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&intval_tgt.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return sVar5;
}

Assistant:

tchecker::state_status_t prev(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                              tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & src_invariant,
                              tchecker::clock_constraint_container_t & guard, tchecker::clock_reset_container_t & reset,
                              tchecker::clock_constraint_container_t & tgt_invariant,
                              tchecker::ta::incoming_edges_value_t const & v)
{
  auto && [sync_edges, valuation] = v;

  // Make a copy of target vloc and intval
  std::vector<tchecker::loc_id_t> vloc_tgt(vloc->capacity());
  copy(vloc_tgt, *vloc);
  std::vector<tchecker::integer_t> intval_tgt(intval->capacity());
  copy(intval_tgt, *intval);

  // Update vloc and intval to source according to v
  for (tchecker::system::edge_const_shared_ptr_t const & e : sync_edges.edges)
    (*vloc)[e->pid()] = e->src();
  tchecker::intvar_id_t id = 0;
  for (tchecker::integer_t i : valuation) {
    (*intval)[id] = i;
    ++id;
  }

  // Make a copy of source vloc and intval
  std::vector<tchecker::loc_id_t> vloc_src(vloc->capacity());
  copy(vloc_src, *vloc);
  std::vector<tchecker::integer_t> intval_src(intval->capacity());
  copy(intval_src, *intval);

  // Apply transition forward to check enabledness and target state
  tchecker::state_status_t status =
      tchecker::ta::next(system, vloc, intval, vedge, sync_id, src_invariant, guard, reset, tgt_invariant, sync_edges);
  if (status != tchecker::STATE_OK)
    return status;

  // Check target vloc and intval are matched
  if (*vloc != vloc_tgt || *intval != intval_tgt)
    return tchecker::STATE_INCOMPATIBLE_EDGE;

  // Update to source vloc and intval
  copy(*vloc, vloc_src);
  copy(*intval, intval_src);
  return tchecker::STATE_OK;
}